

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::write_str<char>
          (BasicWriter<wchar_t> *this,char *s,size_t size,AlignSpec *spec)

{
  long lVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  CharPtr pwVar12;
  long lVar13;
  int iVar19;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar10 = (ulong)(spec->super_WidthSpec).width_;
  puVar3 = *(undefined8 **)(this + 8);
  lVar8 = puVar3[2];
  if (size < uVar10) {
    uVar10 = uVar10 + lVar8;
    if ((ulong)puVar3[3] < uVar10) {
      (**(code **)*puVar3)(puVar3,uVar10);
    }
    puVar3[2] = uVar10;
    auVar6 = _DAT_00146ea0;
    auVar5 = _DAT_00143240;
    auVar4 = _DAT_00143230;
    lVar9 = *(long *)(*(long *)(this + 8) + 8);
    pwVar12 = (CharPtr)(lVar9 + lVar8 * 4);
    uVar10 = (ulong)(spec->super_WidthSpec).width_;
    wVar2 = (spec->super_WidthSpec).fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar7 = uVar10 - size >> 1;
      if (1 < uVar10 - size) {
        uVar11 = uVar7 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar24._8_4_ = (int)uVar11;
        auVar24._0_8_ = uVar11;
        auVar24._12_4_ = (int)(uVar11 >> 0x20);
        lVar1 = lVar9 + lVar8 * 4;
        lVar13 = 0;
        auVar24 = auVar24 ^ _DAT_00143240;
        do {
          auVar21._8_4_ = (int)lVar13;
          auVar21._0_8_ = lVar13;
          auVar21._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar25 = (auVar21 | auVar4) ^ auVar5;
          iVar19 = auVar24._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar19 && auVar24._0_4_ < auVar25._0_4_ ||
                      iVar19 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar1 + lVar13 * 4) = wVar2;
          }
          if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
              auVar25._12_4_ <= auVar24._12_4_) {
            *(wchar_t *)(lVar1 + 4 + lVar13 * 4) = wVar2;
          }
          auVar21 = (auVar21 | auVar6) ^ auVar5;
          iVar26 = auVar21._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar21._0_4_ <= auVar24._0_4_)) {
            *(wchar_t *)(lVar1 + 8 + lVar13 * 4) = wVar2;
            *(wchar_t *)(lVar1 + 0xc + lVar13 * 4) = wVar2;
          }
          lVar13 = lVar13 + 4;
        } while ((uVar11 - ((uint)(uVar7 + 0x3fffffffffffffff) & 3)) + 4 != lVar13);
      }
      auVar6 = _DAT_00146ea0;
      auVar5 = _DAT_00143240;
      auVar4 = _DAT_00143230;
      pwVar12 = pwVar12 + uVar7;
      if (uVar10 != size) {
        uVar10 = (uVar10 * 4 + (uVar7 + size) * -4) - 4;
        auVar25._8_4_ = (int)uVar10;
        auVar25._0_8_ = uVar10;
        auVar25._12_4_ = (int)(uVar10 >> 0x20);
        auVar16._0_8_ = uVar10 >> 2;
        auVar16._8_8_ = auVar25._8_8_ >> 2;
        lVar9 = lVar9 + size * 4 + lVar8 * 4 + uVar7 * 4;
        uVar7 = 0;
        auVar16 = auVar16 ^ _DAT_00143240;
        do {
          auVar22._8_4_ = (int)uVar7;
          auVar22._0_8_ = uVar7;
          auVar22._12_4_ = (int)(uVar7 >> 0x20);
          auVar24 = (auVar22 | auVar4) ^ auVar5;
          iVar19 = auVar16._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar19 && auVar16._0_4_ < auVar24._0_4_ ||
                      iVar19 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar9 + uVar7 * 4) = wVar2;
          }
          if ((auVar24._12_4_ != auVar16._12_4_ || auVar24._8_4_ <= auVar16._8_4_) &&
              auVar24._12_4_ <= auVar16._12_4_) {
            *(wchar_t *)(lVar9 + 4 + uVar7 * 4) = wVar2;
          }
          auVar24 = (auVar22 | auVar6) ^ auVar5;
          iVar26 = auVar24._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar16._0_4_)) {
            *(wchar_t *)(lVar9 + 8 + uVar7 * 4) = wVar2;
            *(wchar_t *)(lVar9 + 0xc + uVar7 * 4) = wVar2;
          }
          uVar7 = uVar7 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar10 - size != 0) {
        uVar7 = (uVar10 * 4 + size * -4) - 4;
        auVar14._8_4_ = (int)uVar7;
        auVar14._0_8_ = uVar7;
        auVar14._12_4_ = (int)(uVar7 >> 0x20);
        auVar15._0_8_ = uVar7 >> 2;
        auVar15._8_8_ = auVar14._8_8_ >> 2;
        lVar9 = lVar9 + lVar8 * 4;
        uVar11 = 0;
        auVar15 = auVar15 ^ _DAT_00143240;
        do {
          auVar20._8_4_ = (int)uVar11;
          auVar20._0_8_ = uVar11;
          auVar20._12_4_ = (int)(uVar11 >> 0x20);
          auVar24 = (auVar20 | auVar4) ^ auVar5;
          iVar19 = auVar15._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar19 && auVar15._0_4_ < auVar24._0_4_ ||
                      iVar19 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar9 + uVar11 * 4) = wVar2;
          }
          if ((auVar24._12_4_ != auVar15._12_4_ || auVar24._8_4_ <= auVar15._8_4_) &&
              auVar24._12_4_ <= auVar15._12_4_) {
            *(wchar_t *)(lVar9 + 4 + uVar11 * 4) = wVar2;
          }
          auVar24 = (auVar20 | auVar6) ^ auVar5;
          iVar26 = auVar24._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar15._0_4_)) {
            *(wchar_t *)(lVar9 + 8 + uVar11 * 4) = wVar2;
            *(wchar_t *)(lVar9 + 0xc + uVar11 * 4) = wVar2;
          }
          uVar11 = uVar11 + 4;
        } while (((uVar7 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
      }
      pwVar12 = pwVar12 + (uVar10 - size);
    }
    else if (uVar10 != size) {
      uVar10 = (uVar10 * 4 + size * -4) - 4;
      auVar17._8_4_ = (int)uVar10;
      auVar17._0_8_ = uVar10;
      auVar17._12_4_ = (int)(uVar10 >> 0x20);
      auVar18._0_8_ = uVar10 >> 2;
      auVar18._8_8_ = auVar17._8_8_ >> 2;
      lVar9 = lVar9 + size * 4 + lVar8 * 4;
      uVar7 = 0;
      auVar18 = auVar18 ^ _DAT_00143240;
      do {
        auVar23._8_4_ = (int)uVar7;
        auVar23._0_8_ = uVar7;
        auVar23._12_4_ = (int)(uVar7 >> 0x20);
        auVar24 = (auVar23 | auVar4) ^ auVar5;
        iVar19 = auVar18._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar19 && auVar18._0_4_ < auVar24._0_4_ ||
                    iVar19 < auVar24._4_4_) & 1)) {
          *(wchar_t *)(lVar9 + uVar7 * 4) = wVar2;
        }
        if ((auVar24._12_4_ != auVar18._12_4_ || auVar24._8_4_ <= auVar18._8_4_) &&
            auVar24._12_4_ <= auVar18._12_4_) {
          *(wchar_t *)(lVar9 + 4 + uVar7 * 4) = wVar2;
        }
        auVar24 = (auVar23 | auVar6) ^ auVar5;
        iVar26 = auVar24._4_4_;
        if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar18._0_4_)) {
          *(wchar_t *)(lVar9 + 8 + uVar7 * 4) = wVar2;
          *(wchar_t *)(lVar9 + 0xc + uVar7 * 4) = wVar2;
        }
        uVar7 = uVar7 + 4;
      } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
    }
  }
  else {
    uVar10 = lVar8 + size;
    if ((ulong)puVar3[3] < uVar10) {
      (**(code **)*puVar3)(puVar3,uVar10);
    }
    puVar3[2] = uVar10;
    pwVar12 = (CharPtr)(lVar8 * 4 + *(long *)(*(long *)(this + 8) + 8));
  }
  if (0 < (long)size) {
    lVar9 = size + 1;
    lVar8 = 0;
    do {
      pwVar12[lVar8] = (int)s[lVar8];
      lVar9 = lVar9 + -1;
      lVar8 = lVar8 + 1;
    } while (1 < lVar9);
  }
  return pwVar12;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}